

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O0

void Wlc_BlastAdderCLA_rec
               (Gia_Man_t *pNew,int *pGen,int *pPro,int *pCar,int nBits,int *pGen1,int *pPro1)

{
  int local_48;
  int iStack_44;
  int pPro2 [2];
  int pGen2 [2];
  int *pGen1_local;
  int nBits_local;
  int *pCar_local;
  int *pPro_local;
  int *pGen_local;
  Gia_Man_t *pNew_local;
  
  if (nBits == 2) {
    Wlc_BlastAdderCLA_one(pNew,pGen,pPro,pCar,pGen1,pPro1,pCar + 1);
  }
  else {
    if (nBits % 2 != 0) {
      __assert_fail("nBits % 2 == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcBlast.c"
                    ,0x14f,
                    "void Wlc_BlastAdderCLA_rec(Gia_Man_t *, int *, int *, int *, int, int *, int *)"
                   );
    }
    Wlc_BlastAdderCLA_rec(pNew,pGen,pPro,pCar,nBits / 2,pPro2,&local_48);
    pCar[nBits / 2] = pPro2[0];
    Wlc_BlastAdderCLA_rec
              (pNew,pGen + nBits / 2,pPro + nBits / 2,pCar + nBits / 2,nBits / 2,pPro2 + 1,
               &iStack_44);
    Wlc_BlastAdderCLA_one(pNew,pPro2,&local_48,pCar,pGen1,pPro1,pCar + nBits / 2);
  }
  return;
}

Assistant:

void Wlc_BlastAdderCLA_rec( Gia_Man_t * pNew, int * pGen, int * pPro, int * pCar, int nBits, int * pGen1, int * pPro1 )
{
    if ( nBits == 2 )
        Wlc_BlastAdderCLA_one( pNew, pGen, pPro, pCar, pGen1, pPro1, pCar+1 ); // returns *pGen1, *pPro1, pCar[1]
    else
    {
        int pGen2[2], pPro2[2];
        assert( nBits % 2 == 0 );
        // call recursively
        Wlc_BlastAdderCLA_rec( pNew, pGen,         pPro,         pCar,         nBits/2, pGen2,   pPro2   );
        pCar[nBits/2] = *pGen2;
        Wlc_BlastAdderCLA_rec( pNew, pGen+nBits/2, pPro+nBits/2, pCar+nBits/2, nBits/2, pGen2+1, pPro2+1 );
        // create structure
        Wlc_BlastAdderCLA_one( pNew, pGen2, pPro2, pCar, pGen1, pPro1, pCar+nBits/2 ); // returns *pGen1, *pPro1, pCar[nBits/2]
    }
}